

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O3

int Curl_cpool_check_limits(Curl_easy *data,connectdata *conn)

{
  Curl_share *pCVar1;
  char *pcVar2;
  curl_off_t cVar3;
  curl_trc_feat *pcVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  _Bool _Var7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  Curl_llist_node *n;
  connectdata *pcVar11;
  timediff_t tVar12;
  connectdata *pcVar13;
  Curl_multi *pCVar14;
  cpool *cpool;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint uVar19;
  curltime cVar20;
  curltime newer;
  curltime older;
  Curl_llist *local_60;
  
  if (data == (Curl_easy *)0x0) {
    return 0;
  }
  pCVar1 = data->share;
  if ((pCVar1 == (Curl_share *)0x0) || ((pCVar1->specifier & 0x20) == 0)) {
    pCVar14 = data->multi_easy;
    if ((pCVar14 == (Curl_multi *)0x0) && (pCVar14 = data->multi, pCVar14 == (Curl_multi *)0x0)) {
      return 0;
    }
    cpool = &pCVar14->cpool;
  }
  else {
    cpool = &pCVar1->cpool;
  }
  pCVar14 = cpool->idata->multi;
  if (pCVar14 == (Curl_multi *)0x0) {
    uVar17 = 0;
    uVar18 = 0;
  }
  else {
    uVar17 = pCVar14->max_host_connections;
    uVar18 = pCVar14->max_total_connections;
  }
  if (uVar17 == 0 && uVar18 == 0) {
    return 0;
  }
  if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
    Curl_share_lock(cpool->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
  }
  cpool->field_0x68 = cpool->field_0x68 | 1;
  if (uVar17 == 0) {
    if (uVar18 == 0) {
      uVar19 = 0;
      goto LAB_0011a24e;
    }
  }
  else {
    pcVar2 = conn->destination;
    sVar8 = strlen(pcVar2);
    local_60 = (Curl_llist *)Curl_hash_pick(&cpool->dest2bundle,pcVar2,sVar8 + 1);
    if (local_60 == (Curl_llist *)0x0) {
      sVar9 = 0;
    }
    else {
      sVar9 = Curl_llist_count(local_60);
    }
    sVar10 = Curl_cshutdn_dest_count(data,conn->destination);
    uVar16 = sVar9 + sVar10;
    if (uVar17 <= uVar16) {
      do {
        if (sVar10 == 0) {
          if (local_60 == (Curl_llist *)0x0) {
            sVar10 = 0;
            break;
          }
          cVar20 = Curl_now();
          n = Curl_llist_head(local_60);
          if (n == (Curl_llist_node *)0x0) {
            sVar10 = 0;
            break;
          }
          lVar15 = -1;
          pcVar13 = (connectdata *)0x0;
          do {
            pcVar11 = (connectdata *)Curl_node_elem(n);
            _Var7 = Curl_uint_spbset_empty(&pcVar11->xfers_attached);
            if ((_Var7) &&
               (uVar5 = (pcVar11->lastused).tv_sec, uVar6 = (pcVar11->lastused).tv_usec,
               older.tv_usec = uVar6, older.tv_sec = uVar5, newer._12_4_ = 0,
               newer.tv_sec = SUB128(cVar20._0_12_,0), newer.tv_usec = SUB124(cVar20._0_12_,8),
               older._12_4_ = 0, tVar12 = Curl_timediff(newer,older), lVar15 < tVar12)) {
              lVar15 = tVar12;
              pcVar13 = pcVar11;
            }
            n = Curl_node_next(n);
          } while (n != (Curl_llist_node *)0x0);
          if (pcVar13 == (connectdata *)0x0) {
            sVar10 = 0;
            break;
          }
          if ((((data->set).field_0x89f & 0x40) != 0) &&
             (((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 ||
               (0 < pcVar4->log_level)) && (0 < Curl_trc_feat_multi.log_level)))) {
            cVar3 = pcVar13->connection_id;
            sVar9 = Curl_llist_count(local_60);
            Curl_trc_multi(data,
                           "Discarding connection #%ld from %zu to reach destination limit of %zu",
                           cVar3,sVar9,uVar17);
          }
          Curl_conn_terminate(cpool->idata,pcVar13,false);
          pcVar2 = conn->destination;
          sVar8 = strlen(pcVar2);
          local_60 = (Curl_llist *)Curl_hash_pick(&cpool->dest2bundle,pcVar2,sVar8 + 1);
          if (local_60 == (Curl_llist *)0x0) {
            local_60 = (Curl_llist *)0x0;
            sVar9 = 0;
          }
          else {
            sVar9 = Curl_llist_count(local_60);
          }
        }
        else {
          _Var7 = Curl_cshutdn_close_oldest(data,conn->destination);
          if (!_Var7) break;
        }
        sVar10 = Curl_cshutdn_dest_count(cpool->idata,conn->destination);
      } while (uVar17 <= sVar10 + sVar9);
      uVar16 = sVar10 + sVar9;
    }
    uVar19 = (uint)(uVar17 <= uVar16);
    if ((uVar17 <= uVar16) || (uVar18 == 0)) goto LAB_0011a24e;
  }
  sVar9 = Curl_cshutdn_count(cpool->idata);
  uVar17 = cpool->num_conn + sVar9;
  if (uVar18 <= uVar17) {
    do {
      if (sVar9 == 0) {
        pcVar13 = cpool_get_oldest_idle(cpool);
        if (pcVar13 == (connectdata *)0x0) {
          sVar9 = 0;
          break;
        }
        if (((((data->set).field_0x89f & 0x40) != 0) &&
            ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level)
             ))) && (0 < Curl_trc_feat_multi.log_level)) {
          Curl_trc_multi(data,"Discarding connection #%ld from %zu to reach total limit of %zu",
                         pcVar13->connection_id,cpool->num_conn,uVar18);
        }
        Curl_conn_terminate(cpool->idata,pcVar13,false);
      }
      else {
        _Var7 = Curl_cshutdn_close_oldest(data,(char *)0x0);
        if (!_Var7) break;
      }
      sVar9 = Curl_cshutdn_count(cpool->idata);
    } while (uVar18 <= sVar9 + cpool->num_conn);
    uVar17 = sVar9 + cpool->num_conn;
  }
  uVar19 = (uint)(uVar18 <= uVar17) * 2;
LAB_0011a24e:
  cpool->field_0x68 = cpool->field_0x68 & 0xfe;
  if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
    Curl_share_unlock(cpool->idata,CURL_LOCK_DATA_CONNECT);
  }
  return uVar19;
}

Assistant:

int Curl_cpool_check_limits(struct Curl_easy *data,
                            struct connectdata *conn)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct cpool_bundle *bundle;
  size_t dest_limit = 0;
  size_t total_limit = 0;
  size_t shutdowns;
  int result = CPOOL_LIMIT_OK;

  if(!cpool)
    return CPOOL_LIMIT_OK;

  if(cpool->idata->multi) {
    dest_limit = cpool->idata->multi->max_host_connections;
    total_limit = cpool->idata->multi->max_total_connections;
  }

  if(!dest_limit && !total_limit)
    return CPOOL_LIMIT_OK;

  CPOOL_LOCK(cpool, cpool->idata);
  if(dest_limit) {
    size_t live;

    bundle = cpool_find_bundle(cpool, conn);
    live = bundle ? Curl_llist_count(&bundle->conns) : 0;
    shutdowns = Curl_cshutdn_dest_count(data, conn->destination);
    while((live  + shutdowns) >= dest_limit) {
      if(shutdowns) {
        /* close one connection in shutdown right away, if we can */
        if(!Curl_cshutdn_close_oldest(data, conn->destination))
          break;
      }
      else if(!bundle)
        break;
      else {
        struct connectdata *oldest_idle = NULL;
        /* The bundle is full. Extract the oldest connection that may
         * be removed now, if there is one. */
        oldest_idle = cpool_bundle_get_oldest_idle(bundle);
        if(!oldest_idle)
          break;
        /* disconnect the old conn and continue */
        CURL_TRC_M(data, "Discarding connection #%"
                     FMT_OFF_T " from %zu to reach destination "
                     "limit of %zu", oldest_idle->connection_id,
                     Curl_llist_count(&bundle->conns), dest_limit);
        Curl_conn_terminate(cpool->idata, oldest_idle, FALSE);

        /* in case the bundle was destroyed in disconnect, look it up again */
        bundle = cpool_find_bundle(cpool, conn);
        live = bundle ? Curl_llist_count(&bundle->conns) : 0;
      }
      shutdowns = Curl_cshutdn_dest_count(cpool->idata, conn->destination);
    }
    if((live + shutdowns) >= dest_limit) {
      result = CPOOL_LIMIT_DEST;
      goto out;
    }
  }

  if(total_limit) {
    shutdowns = Curl_cshutdn_count(cpool->idata);
    while((cpool->num_conn + shutdowns) >= total_limit) {
      if(shutdowns) {
        /* close one connection in shutdown right away, if we can */
        if(!Curl_cshutdn_close_oldest(data, NULL))
          break;
      }
      else {
        struct connectdata *oldest_idle = cpool_get_oldest_idle(cpool);
        if(!oldest_idle)
          break;
        /* disconnect the old conn and continue */
        CURL_TRC_M(data, "Discarding connection #%"
                   FMT_OFF_T " from %zu to reach total "
                   "limit of %zu",
                   oldest_idle->connection_id, cpool->num_conn, total_limit);
        Curl_conn_terminate(cpool->idata, oldest_idle, FALSE);
      }
      shutdowns = Curl_cshutdn_count(cpool->idata);
    }
    if((cpool->num_conn + shutdowns) >= total_limit) {
      result = CPOOL_LIMIT_TOTAL;
      goto out;
    }
  }

out:
  CPOOL_UNLOCK(cpool, cpool->idata);
  return result;
}